

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yl_schema_features.c
# Opt level: O0

void get_features(ly_set *fset,char *module,char ***features)

{
  lyd_node *plVar1;
  int iVar2;
  yl_schema_features *sf;
  uint32_t u;
  char ***features_local;
  char *module_local;
  ly_set *fset_local;
  
  sf._4_4_ = 0;
  while( true ) {
    if (fset->count <= sf._4_4_) {
      *features = (char **)0x0;
      return;
    }
    plVar1 = (fset->field_2).dnodes[sf._4_4_];
    iVar2 = strcmp(module,*(char **)plVar1);
    if (iVar2 == 0) break;
    sf._4_4_ = sf._4_4_ + 1;
  }
  *features = (char **)plVar1->schema;
  *(undefined1 *)&plVar1->parent = 1;
  return;
}

Assistant:

void
get_features(const struct ly_set *fset, const char *module, const char ***features)
{
    /* get features list for this module */
    for (uint32_t u = 0; u < fset->count; ++u) {
        struct yl_schema_features *sf = (struct yl_schema_features *)fset->objs[u];

        if (!strcmp(module, sf->mod_name)) {
            /* matched module - explicitly set features */
            *features = (const char **)sf->features;
            sf->applied = 1;
            return;
        }
    }

    /* features not set so disable all */
    *features = NULL;
}